

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model_dict.hpp
# Opt level: O2

void __thiscall
cimod::
BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
::add_variables_from
          (BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
           *this,Linear<std::__cxx11::basic_string<char>,_double> *linear)

{
  __node_base *p_Var1;
  
  p_Var1 = &(linear->_M_h)._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    add_variable(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (p_Var1 + 1),(double *)(p_Var1 + 5));
  }
  return;
}

Assistant:

void add_variables_from( const Linear<IndexType, FloatType> &linear ) {
      for ( auto &it : linear ) {
        add_variable( it.first, it.second );
      }
    }